

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdPubkeyTweakMul(void *handle,char *pubkey,char *tweak,char **output)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData256 tweak_data;
  Pubkey key;
  undefined1 local_98 [32];
  Pubkey local_78;
  ByteData256 local_60;
  Pubkey local_48;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_98._0_8_ = "cfdcapi_key.cpp";
    local_98._8_4_ = 0x5c9;
    local_98._16_8_ = "CfdPubkeyTweakMul";
    cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"output is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar2) {
    bVar2 = cfd::capi::IsEmptyString(tweak);
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_98,pubkey,(allocator *)&local_60);
      cfd::core::Pubkey::Pubkey(&local_48,(string *)local_98);
      pcVar1 = local_98 + 0x10;
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      std::__cxx11::string::string((string *)local_98,tweak,(allocator *)&local_78);
      cfd::core::ByteData256::ByteData256(&local_60,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      cfd::core::Pubkey::CreateTweakMul(&local_78,&local_48,&local_60);
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_98,&local_78);
      pcVar3 = cfd::capi::CreateString((string *)local_98);
      *output = pcVar3;
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_98._0_8_ = "cfdcapi_key.cpp";
    local_98._8_4_ = 0x5d5;
    local_98._16_8_ = "CfdPubkeyTweakMul";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"tweak is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. tweak is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_98._0_8_ = "cfdcapi_key.cpp";
  local_98._8_4_ = 0x5cf;
  local_98._16_8_ = "CfdPubkeyTweakMul";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPubkeyTweakMul(
    void* handle, const char* pubkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    Pubkey key(pubkey);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakMul(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}